

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddConvexPolyFilled(ImDrawList *this,ImVec2 *points,int points_count,ImU32 col)

{
  long lVar1;
  short sVar2;
  short sVar3;
  float *pfVar4;
  float *pfVar5;
  ImDrawIdx IVar6;
  float fVar7;
  float fVar8;
  undefined8 uStack_c0;
  ImDrawList *local_b8;
  int local_b0;
  int local_ac;
  int i_2;
  int i_1;
  int vtx_count_1;
  int idx_count_1;
  float inv_len2;
  float d2_1;
  float dm_y;
  float dm_x;
  ImVec2 *n1;
  ImVec2 *n0;
  int i1_1;
  int i0_1;
  float inv_len;
  float d2;
  float dy;
  float dx;
  ImVec2 *p1;
  ImVec2 *p0;
  int i1;
  int i0;
  ImVec2 *temp_normals;
  int local_40;
  int i;
  uint vtx_outer_idx;
  uint vtx_inner_idx;
  int vtx_count;
  int idx_count;
  ImU32 col_trans;
  float AA_SIZE;
  ImVec2 uv;
  ImU32 col_local;
  int points_count_local;
  ImVec2 *points_local;
  ImDrawList *this_local;
  
  if (2 < points_count) {
    _col_trans = this->_Data->TexUvWhitePixel;
    local_b8 = this;
    uv.x = (float)col;
    uv.y = (float)points_count;
    if ((this->Flags & 4U) == 0) {
      i_1 = (points_count + -2) * 3;
      uStack_c0 = 0x17ba69;
      i_2 = points_count;
      PrimReserve(this,i_1,points_count);
      for (local_ac = 0; local_ac < i_2; local_ac = local_ac + 1) {
        local_b8->_VtxWritePtr->pos = points[local_ac];
        local_b8->_VtxWritePtr->uv = _col_trans;
        local_b8->_VtxWritePtr->col = (ImU32)uv.x;
        local_b8->_VtxWritePtr = local_b8->_VtxWritePtr + 1;
      }
      for (local_b0 = 2; local_b0 < (int)uv.y; local_b0 = local_b0 + 1) {
        *local_b8->_IdxWritePtr = (ImDrawIdx)local_b8->_VtxCurrentIdx;
        local_b8->_IdxWritePtr[1] = ((short)local_b8->_VtxCurrentIdx + (short)local_b0) - 1;
        local_b8->_IdxWritePtr[2] = (short)local_b8->_VtxCurrentIdx + (short)local_b0;
        local_b8->_IdxWritePtr = local_b8->_IdxWritePtr + 3;
      }
      local_b8->_VtxCurrentIdx = (i_2 & 0xffffU) + local_b8->_VtxCurrentIdx;
    }
    else {
      idx_count = (int)this->_FringeScale;
      vtx_count = col & 0xffffff;
      vtx_inner_idx = points_count * 9 - 6;
      vtx_outer_idx = points_count << 1;
      uStack_c0 = 0x17b5a4;
      PrimReserve(this,vtx_inner_idx,vtx_outer_idx);
      i = local_b8->_VtxCurrentIdx;
      local_40 = local_b8->_VtxCurrentIdx + 1;
      for (temp_normals._4_4_ = 2; temp_normals._4_4_ < (int)uv.y;
          temp_normals._4_4_ = temp_normals._4_4_ + 1) {
        IVar6 = (ImDrawIdx)i;
        *local_b8->_IdxWritePtr = IVar6;
        local_b8->_IdxWritePtr[1] = IVar6 + ((short)temp_normals._4_4_ + -1) * 2;
        local_b8->_IdxWritePtr[2] = IVar6 + (short)(temp_normals._4_4_ << 1);
        local_b8->_IdxWritePtr = local_b8->_IdxWritePtr + 3;
      }
      lVar1 = -((long)(int)uv.y * 8 + 0xfU & 0xfffffffffffffff0);
      _i1 = (long)&local_b8 + lVar1;
      p0._4_4_ = (int)uv.y + -1;
      for (p0._0_4_ = 0; (int)p0 < (int)uv.y; p0._0_4_ = (int)p0 + 1) {
        p1 = points + p0._4_4_;
        _dy = points + (int)p0;
        d2 = _dy->x - p1->x;
        inv_len = _dy->y - p1->y;
        fVar7 = d2 * d2 + inv_len * inv_len;
        if (0.0 < fVar7) {
          i0_1 = (int)fVar7;
          *(undefined8 *)((long)&uStack_c0 + lVar1) = 0x17b6e4;
          i1_1 = (int)ImRsqrt(fVar7);
          d2 = (float)i1_1 * d2;
          inv_len = (float)i1_1 * inv_len;
        }
        *(float *)(_i1 + (long)p0._4_4_ * 8) = inv_len;
        *(float *)(_i1 + 4 + (long)p0._4_4_ * 8) = -d2;
        p0._4_4_ = (int)p0;
      }
      n0._4_4_ = (int)uv.y + -1;
      for (n0._0_4_ = 0; (int)n0 < (int)uv.y; n0._0_4_ = (int)n0 + 1) {
        pfVar4 = (float *)(_i1 + (long)n0._4_4_ * 8);
        pfVar5 = (float *)(_i1 + (long)(int)n0 * 8);
        d2_1 = (*pfVar4 + *pfVar5) * 0.5;
        inv_len2 = (pfVar4[1] + pfVar5[1]) * 0.5;
        fVar7 = d2_1 * d2_1 + inv_len2 * inv_len2;
        if (1e-06 < fVar7) {
          vtx_count_1 = (int)(1.0 / fVar7);
          if (100.0 < (float)vtx_count_1) {
            vtx_count_1 = 0x42c80000;
          }
          d2_1 = (float)vtx_count_1 * d2_1;
          inv_len2 = (float)vtx_count_1 * inv_len2;
        }
        fVar7 = (float)idx_count * 0.5 * d2_1;
        fVar8 = (float)idx_count * 0.5 * inv_len2;
        (local_b8->_VtxWritePtr->pos).x = points[(int)n0].x - fVar7;
        (local_b8->_VtxWritePtr->pos).y = points[(int)n0].y - fVar8;
        local_b8->_VtxWritePtr->uv = _col_trans;
        local_b8->_VtxWritePtr->col = (ImU32)uv.x;
        local_b8->_VtxWritePtr[1].pos.x = points[(int)n0].x + fVar7;
        local_b8->_VtxWritePtr[1].pos.y = points[(int)n0].y + fVar8;
        local_b8->_VtxWritePtr[1].uv = _col_trans;
        local_b8->_VtxWritePtr[1].col = vtx_count;
        local_b8->_VtxWritePtr = local_b8->_VtxWritePtr + 2;
        sVar2 = (short)i;
        *local_b8->_IdxWritePtr = sVar2 + (short)((int)n0 << 1);
        local_b8->_IdxWritePtr[1] = sVar2 + (short)(n0._4_4_ << 1);
        sVar3 = (short)local_40;
        local_b8->_IdxWritePtr[2] = sVar3 + (short)(n0._4_4_ << 1);
        local_b8->_IdxWritePtr[3] = sVar3 + (short)(n0._4_4_ << 1);
        local_b8->_IdxWritePtr[4] = sVar3 + (short)((int)n0 << 1);
        local_b8->_IdxWritePtr[5] = sVar2 + (short)((int)n0 << 1);
        local_b8->_IdxWritePtr = local_b8->_IdxWritePtr + 6;
        n0._4_4_ = (int)n0;
      }
      local_b8->_VtxCurrentIdx = (vtx_outer_idx & 0xffff) + local_b8->_VtxCurrentIdx;
    }
  }
  return;
}

Assistant:

void ImDrawList::AddConvexPolyFilled(const ImVec2* points, const int points_count, ImU32 col)
{
    if (points_count < 3)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    if (Flags & ImDrawListFlags_AntiAliasedFill)
    {
        // Anti-aliased Fill
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;
        const int idx_count = (points_count - 2)*3 + points_count * 6;
        const int vtx_count = (points_count * 2);
        PrimReserve(idx_count, vtx_count);

        // Add indexes for fill
        unsigned int vtx_inner_idx = _VtxCurrentIdx;
        unsigned int vtx_outer_idx = _VtxCurrentIdx + 1;
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + ((i - 1) << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_inner_idx + (i << 1));
            _IdxWritePtr += 3;
        }

        // Compute normals
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * sizeof(ImVec2)); //-V630
        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            const ImVec2& p0 = points[i0];
            const ImVec2& p1 = points[i1];
            float dx = p1.x - p0.x;
            float dy = p1.y - p0.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i0].x = dy;
            temp_normals[i0].y = -dx;
        }

        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            // Average normals
            const ImVec2& n0 = temp_normals[i0];
            const ImVec2& n1 = temp_normals[i1];
            float dm_x = (n0.x + n1.x) * 0.5f;
            float dm_y = (n0.y + n1.y) * 0.5f;
            IM_FIXNORMAL2F(dm_x, dm_y);
            dm_x *= AA_SIZE * 0.5f;
            dm_y *= AA_SIZE * 0.5f;

            // Add vertices
            _VtxWritePtr[0].pos.x = (points[i1].x - dm_x); _VtxWritePtr[0].pos.y = (points[i1].y - dm_y); _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;        // Inner
            _VtxWritePtr[1].pos.x = (points[i1].x + dm_x); _VtxWritePtr[1].pos.y = (points[i1].y + dm_y); _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;  // Outer
            _VtxWritePtr += 2;

            // Add indexes for fringes
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + (i0 << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1));
            _IdxWritePtr[3] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1)); _IdxWritePtr[4] = (ImDrawIdx)(vtx_outer_idx + (i1 << 1)); _IdxWritePtr[5] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1));
            _IdxWritePtr += 6;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Fill
        const int idx_count = (points_count - 2)*3;
        const int vtx_count = points_count;
        PrimReserve(idx_count, vtx_count);
        for (int i = 0; i < vtx_count; i++)
        {
            _VtxWritePtr[0].pos = points[i]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr++;
        }
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + i - 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + i);
            _IdxWritePtr += 3;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
}